

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O3

ssize_t __thiscall diffusion::NetReader::read(NetReader *this,int __fd,void *__buf,size_t __nbytes)

{
  char cVar1;
  ErrorNoData *this_00;
  vector<char,_std::allocator<char>_> *data;
  undefined4 in_register_00000034;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  cVar1 = (**(code **)*puVar2)(puVar2);
  if (cVar1 != '\0') {
    (this->super_Reader)._vptr_Reader = (_func_int **)0x0;
    (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->receiver_).super___shared_ptr<diffusion::Receiver,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Tokenizer::pop((Tokenizer *)(puVar2 + 4),(vector<char,_std::allocator<char>_> *)this);
    return (ssize_t)this;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<char> NetReader::read() {
    if (this->can_read()) {
        // Assuming single thread.
        std::vector<char> data(0);
        data_queue_.pop(data);
        return data;
    } else {
        throw ErrorNoData();
    }
}